

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterOutputNSDecl(xmlTextWriterPtr writer)

{
  int iVar1;
  xmlLinkPtr lk_00;
  undefined8 *puVar2;
  xmlChar *local_40;
  xmlChar *prefix;
  xmlChar *namespaceURI;
  int sum;
  int count;
  xmlTextWriterNsStackEntry *np;
  xmlLinkPtr lk;
  xmlTextWriterPtr writer_local;
  
  namespaceURI._0_4_ = 0;
  while( true ) {
    do {
      iVar1 = xmlListEmpty(writer->nsstack);
      if (iVar1 != 0) {
        return (int)namespaceURI;
      }
      prefix = (xmlChar *)0x0;
      local_40 = (xmlChar *)0x0;
      lk_00 = xmlListFront(writer->nsstack);
      puVar2 = (undefined8 *)xmlLinkGetData(lk_00);
      if (puVar2 != (undefined8 *)0x0) {
        prefix = xmlStrdup((xmlChar *)puVar2[1]);
        local_40 = xmlStrdup((xmlChar *)*puVar2);
      }
      xmlListPopFront(writer->nsstack);
    } while (puVar2 == (undefined8 *)0x0);
    iVar1 = xmlTextWriterWriteAttribute(writer,local_40,prefix);
    (*xmlFree)(prefix);
    (*xmlFree)(local_40);
    if (iVar1 < 0) break;
    namespaceURI._0_4_ = iVar1 + (int)namespaceURI;
  }
  xmlListDelete(writer->nsstack);
  writer->nsstack = (xmlListPtr)0x0;
  return -1;
}

Assistant:

static int
xmlTextWriterOutputNSDecl(xmlTextWriterPtr writer)
{
    xmlLinkPtr lk;
    xmlTextWriterNsStackEntry *np;
    int count;
    int sum;

    sum = 0;
    while (!xmlListEmpty(writer->nsstack)) {
        xmlChar *namespaceURI = NULL;
        xmlChar *prefix = NULL;

        lk = xmlListFront(writer->nsstack);
        np = (xmlTextWriterNsStackEntry *) xmlLinkGetData(lk);

        if (np != 0) {
            namespaceURI = xmlStrdup(np->uri);
            prefix = xmlStrdup(np->prefix);
        }

        xmlListPopFront(writer->nsstack);

        if (np != 0) {
            count = xmlTextWriterWriteAttribute(writer, prefix, namespaceURI);
            xmlFree(namespaceURI);
            xmlFree(prefix);

            if (count < 0) {
                xmlListDelete(writer->nsstack);
                writer->nsstack = NULL;
                return -1;
            }
            sum += count;
        }
    }
    return sum;
}